

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_splitter.cc
# Opt level: O3

void brotli::FindBlocks<unsigned_short,520>
               (unsigned_short *data,size_t length,double block_switch_bitcost,
               vector<brotli::Histogram<520>,_std::allocator<brotli::Histogram<520>_>_> *vec,
               uint8_t *block_id)

{
  ushort uVar1;
  uint uVar2;
  byte bVar3;
  long lVar4;
  void *__s;
  void *__s_00;
  void *__s_01;
  ulong uVar5;
  void *pvVar6;
  size_t j;
  long lVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  
  lVar4 = (long)(vec->
                super__Vector_base<brotli::Histogram<520>,_std::allocator<brotli::Histogram<520>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(vec->
                super__Vector_base<brotli::Histogram<520>,_std::allocator<brotli::Histogram<520>_>_>
                )._M_impl.super__Vector_impl_data._M_start >> 4;
  uVar10 = lVar4 * 0x3e88cb3c9484e2b;
  if (uVar10 < 2) {
    if (length == 0) {
      return;
    }
    memset(block_id,0,length);
    return;
  }
  if (0x100 < uVar10) {
    __assert_fail("vecsize <= 256",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/deps/brotli/enc/block_splitter.cc"
                  ,0xac,
                  "void brotli::FindBlocks(const DataType *, const size_t, const double, const std::vector<Histogram<kSize>> &, uint8_t *) [DataType = unsigned short, kSize = 520]"
                 );
  }
  __s = operator_new__(lVar4 * -0x7d1196792909c540);
  lVar7 = 0;
  memset(__s,0,lVar4 * -0x7d1196792909c540);
  lVar11 = 0x104;
  do {
    uVar5 = (ulong)((vec->
                    super__Vector_base<brotli::Histogram<520>,_std::allocator<brotli::Histogram<520>_>_>
                    )._M_impl.super__Vector_impl_data._M_start)->data_[lVar11 * 2];
    if (uVar5 < 0x100) {
      dVar13 = (double)*(float *)(kLog2Table + uVar5 * 4);
    }
    else {
      dVar13 = log2((double)uVar5);
    }
    *(double *)((long)__s + lVar7 * 8) = dVar13;
    lVar7 = lVar7 + 1;
    lVar11 = lVar11 + 0x106;
  } while (uVar10 - lVar7 != 0);
  lVar11 = lVar4 * 0x63aa03e88cb3c968;
  lVar7 = 0x208;
  lVar8 = 0x81c;
  do {
    lVar7 = lVar7 + -1;
    lVar12 = 0;
    lVar9 = lVar8;
    do {
      dVar13 = *(double *)((long)__s + lVar12 * 8);
      uVar2 = *(uint *)((long)((vec->
                               super__Vector_base<brotli::Histogram<520>,_std::allocator<brotli::Histogram<520>_>_>
                               )._M_impl.super__Vector_impl_data._M_start)->data_ + lVar9);
      uVar5 = (ulong)uVar2;
      dVar14 = -2.0;
      if (uVar5 != 0) {
        if (uVar2 < 0x100) {
          dVar14 = (double)*(float *)(kLog2Table + uVar5 * 4);
        }
        else {
          dVar14 = log2((double)uVar5);
        }
      }
      *(double *)((long)__s + lVar12 * 8 + lVar11) = dVar13 - dVar14;
      lVar12 = lVar12 + 1;
      lVar9 = lVar9 + 0x830;
    } while (uVar10 - lVar12 != 0);
    lVar11 = lVar11 + lVar4 * -0x1f44659e4a427158;
    lVar8 = lVar8 + -4;
  } while (lVar7 != 0);
  __s_00 = operator_new__(lVar4 * 0x1f44659e4a427158);
  memset(__s_00,0,lVar4 * 0x1f44659e4a427158);
  __s_01 = operator_new__(uVar10 * length);
  memset(__s_01,0,uVar10 * length);
  if (length == 0) {
    lVar7 = -1;
  }
  else {
    uVar5 = 0;
    pvVar6 = __s_01;
    do {
      uVar1 = data[uVar5];
      lVar7 = 0;
      dVar13 = 1e+99;
      do {
        dVar14 = *(double *)((long)__s + lVar7 * 8 + uVar1 * uVar10 * 8) +
                 *(double *)((long)__s_00 + lVar7 * 8);
        *(double *)((long)__s_00 + lVar7 * 8) = dVar14;
        if (dVar14 < dVar13) {
          block_id[uVar5] = (uint8_t)lVar7;
          dVar13 = dVar14;
        }
        lVar7 = lVar7 + 1;
      } while (uVar10 - lVar7 != 0);
      dVar14 = block_switch_bitcost;
      if (uVar5 < 2000) {
        dVar14 = (((double)(long)uVar5 * 0.07) / 2000.0 + 0.77) * block_switch_bitcost;
      }
      lVar7 = 0;
      do {
        dVar15 = *(double *)((long)__s_00 + lVar7 * 8) - dVar13;
        *(double *)((long)__s_00 + lVar7 * 8) = dVar15;
        if (dVar14 <= dVar15) {
          *(double *)((long)__s_00 + lVar7 * 8) = dVar14;
          *(undefined1 *)((long)pvVar6 + lVar7) = 1;
        }
        lVar7 = lVar7 + 1;
      } while (uVar10 - lVar7 != 0);
      uVar5 = uVar5 + 1;
      pvVar6 = (void *)((long)pvVar6 + uVar10);
    } while (uVar5 != length);
    lVar7 = length - 1;
    if (lVar7 == 0) goto LAB_00174426;
  }
  bVar3 = block_id[lVar7];
  pvVar6 = (void *)((long)__s_01 + (length - 2) * uVar10);
  do {
    if (*(char *)((long)pvVar6 + (ulong)bVar3) == '\x01') {
      bVar3 = block_id[length - 2];
    }
    block_id[length - 2] = bVar3;
    pvVar6 = (void *)((long)pvVar6 + lVar4 * -0x3e88cb3c9484e2b);
    length = length - 1;
  } while (length != 1);
LAB_00174426:
  operator_delete__(__s);
  operator_delete__(__s_00);
  operator_delete__(__s_01);
  return;
}

Assistant:

void FindBlocks(const DataType* data, const size_t length,
                const double block_switch_bitcost,
                const std::vector<Histogram<kSize> > &vec,
                uint8_t *block_id) {
  if (vec.size() <= 1) {
    for (size_t i = 0; i < length; ++i) {
      block_id[i] = 0;
    }
    return;
  }
  size_t vecsize = vec.size();
  assert(vecsize <= 256);
  double* insert_cost = new double[kSize * vecsize];
  memset(insert_cost, 0, sizeof(insert_cost[0]) * kSize * vecsize);
  for (size_t j = 0; j < vecsize; ++j) {
    insert_cost[j] = FastLog2(static_cast<uint32_t>(vec[j].total_count_));
  }
  for (size_t i = kSize; i != 0;) {
    --i;
    for (size_t j = 0; j < vecsize; ++j) {
      insert_cost[i * vecsize + j] = insert_cost[j] - BitCost(vec[j].data_[i]);
    }
  }
  double *cost = new double[vecsize];
  memset(cost, 0, sizeof(cost[0]) * vecsize);
  bool* switch_signal = new bool[length * vecsize];
  memset(switch_signal, 0, sizeof(switch_signal[0]) * length * vecsize);
  // After each iteration of this loop, cost[k] will contain the difference
  // between the minimum cost of arriving at the current byte position using
  // entropy code k, and the minimum cost of arriving at the current byte
  // position. This difference is capped at the block switch cost, and if it
  // reaches block switch cost, it means that when we trace back from the last
  // position, we need to switch here.
  for (size_t byte_ix = 0; byte_ix < length; ++byte_ix) {
    size_t ix = byte_ix * vecsize;
    size_t insert_cost_ix = data[byte_ix] * vecsize;
    double min_cost = 1e99;
    for (size_t k = 0; k < vecsize; ++k) {
      // We are coding the symbol in data[byte_ix] with entropy code k.
      cost[k] += insert_cost[insert_cost_ix + k];
      if (cost[k] < min_cost) {
        min_cost = cost[k];
        block_id[byte_ix] = static_cast<uint8_t>(k);
      }
    }
    double block_switch_cost = block_switch_bitcost;
    // More blocks for the beginning.
    if (byte_ix < 2000) {
      block_switch_cost *= 0.77 + 0.07 * static_cast<double>(byte_ix) / 2000;
    }
    for (size_t k = 0; k < vecsize; ++k) {
      cost[k] -= min_cost;
      if (cost[k] >= block_switch_cost) {
        cost[k] = block_switch_cost;
        switch_signal[ix + k] = true;
      }
    }
  }
  // Now trace back from the last position and switch at the marked places.
  size_t byte_ix = length - 1;
  size_t ix = byte_ix * vecsize;
  uint8_t cur_id = block_id[byte_ix];
  while (byte_ix > 0) {
    --byte_ix;
    ix -= vecsize;
    if (switch_signal[ix + cur_id]) {
      cur_id = block_id[byte_ix];
    }
    block_id[byte_ix] = cur_id;
  }
  delete[] insert_cost;
  delete[] cost;
  delete[] switch_signal;
}